

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O1

void __thiscall DL::Data::Data(Data *this,string_t *key,Integer i)

{
  pointer pcVar1;
  string_t local_40;
  
  (this->mKey)._M_dataplus._M_p = (pointer)&(this->mKey).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + key->_M_string_length);
  this->mType = DT_Integer;
  (this->field_2).mInt = i;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  DataGroup::DataGroup(&this->mGroup,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->mString)._M_dataplus._M_p = (pointer)&(this->mString).field_2;
  (this->mString)._M_string_length = 0;
  (this->mString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Data::Data(const string_t& key, Integer i)
	: mKey(key)
	, mType(DT_Integer)
	, mInt(i)
{
}